

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum-dtoa.cpp
# Opt level: O2

void icu_63::double_conversion::GenerateCountedDigits
               (int count,int *decimal_point,Bignum *numerator,Bignum *denominator,
               Vector<char> buffer,int *length)

{
  uint16_t uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar4;
  
  pcVar5 = buffer.start_;
  uVar3 = count - 1;
  uVar4 = (ulong)uVar3;
  uVar7 = 0;
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  while( true ) {
    uVar1 = Bignum::DivideModuloIntBignum(numerator,denominator);
    if (uVar6 == uVar7) break;
    pcVar5[uVar7] = (char)uVar1 + '0';
    Bignum::Times10(numerator);
    uVar7 = uVar7 + 1;
  }
  iVar2 = Bignum::PlusCompare(numerator,numerator,denominator);
  pcVar5[(int)uVar3] = (char)uVar1 + (-1 < iVar2) + '0';
  while ((0 < (int)uVar4 && (pcVar5[uVar4] == ':'))) {
    pcVar5[uVar4] = '0';
    uVar4 = (ulong)((int)uVar4 - 1);
    pcVar5[uVar4] = pcVar5[uVar4] + '\x01';
  }
  if (*pcVar5 == ':') {
    *pcVar5 = '1';
    *decimal_point = *decimal_point + 1;
  }
  *buffer._8_8_ = count;
  return;
}

Assistant:

static void GenerateCountedDigits(int count, int* decimal_point,
                                  Bignum* numerator, Bignum* denominator,
                                  Vector<char> buffer, int* length) {
  ASSERT(count >= 0);
  for (int i = 0; i < count - 1; ++i) {
    uint16_t digit;
    digit = numerator->DivideModuloIntBignum(*denominator);
    ASSERT(digit <= 9);  // digit is a uint16_t and therefore always positive.
    // digit = numerator / denominator (integer division).
    // numerator = numerator % denominator.
    buffer[i] = static_cast<char>(digit + '0');
    // Prepare for next iteration.
    numerator->Times10();
  }
  // Generate the last digit.
  uint16_t digit;
  digit = numerator->DivideModuloIntBignum(*denominator);
  if (Bignum::PlusCompare(*numerator, *numerator, *denominator) >= 0) {
    digit++;
  }
  ASSERT(digit <= 10);
  buffer[count - 1] = static_cast<char>(digit + '0');
  // Correct bad digits (in case we had a sequence of '9's). Propagate the
  // carry until we hat a non-'9' or til we reach the first digit.
  for (int i = count - 1; i > 0; --i) {
    if (buffer[i] != '0' + 10) break;
    buffer[i] = '0';
    buffer[i - 1]++;
  }
  if (buffer[0] == '0' + 10) {
    // Propagate a carry past the top place.
    buffer[0] = '1';
    (*decimal_point)++;
  }
  *length = count;
}